

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O2

void __thiscall HawkTracer::parser::KlassRegister::KlassRegister(KlassRegister *this)

{
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> _Var1;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  klass_field_info_event;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  klass_info_event;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  endianness_event;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  base_event;
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> local_b8;
  FieldTypeId local_ac;
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> local_a8;
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> local_a0;
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> local_98;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_90;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_88;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_80;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_78;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_70;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_68;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_60;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_58;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_50;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_48;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_40;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_38;
  __uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_30;
  __uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_28;
  __uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_20;
  __uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  local_18;
  
  *(undefined8 *)((long)&(this->_register_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_register_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_register_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_register_mtx).super___mutex_base._M_mutex + 8) = 0;
  (this->_register_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_register)._M_h._M_buckets = &(this->_register)._M_h._M_single_bucket;
  (this->_register)._M_h._M_bucket_count = 1;
  (this->_register)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_register)._M_h._M_element_count = 0;
  (this->_register)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_register)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_register)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_head_impl._0_4_ = 1;
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[9],unsigned_int>
            ((parser *)&local_98,(char (*) [9])"HT_Event",(uint *)&local_a0);
  _Var1._M_head_impl = local_98._M_head_impl;
  local_a0._M_head_impl._0_4_ = 4;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[9],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_38,(char (*) [9])0x1154e7,(char (*) [9])"uint32_t",
             (FieldTypeId *)&local_a0);
  EventKlass::add_field(_Var1._M_head_impl,&local_38);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_38);
  _Var1._M_head_impl = local_98._M_head_impl;
  local_a0._M_head_impl._0_4_ = 6;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[10],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_40,(char (*) [10])"timestamp",(char (*) [9])"uint64_t",
             (FieldTypeId *)&local_a0);
  EventKlass::add_field(_Var1._M_head_impl,&local_40);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_40);
  _Var1._M_head_impl = local_98._M_head_impl;
  local_a0._M_head_impl._0_4_ = 6;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[3],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_48,(char (*) [3])0x1154ed,(char (*) [9])"uint64_t",
             (FieldTypeId *)&local_a0);
  EventKlass::add_field(_Var1._M_head_impl,&local_48);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_48);
  local_18._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
  .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl =
       (tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
        )(tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
          )local_98._M_head_impl;
  local_98._M_head_impl = (EventKlass *)0x0;
  _add_klass(this,(unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                   *)&local_18);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_18);
  local_a8._M_head_impl._0_4_ = 0;
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[23],unsigned_int>
            ((parser *)&local_a0,(char (*) [23])"HT_EndiannessInfoEvent",(uint *)&local_a8);
  _Var1._M_head_impl = local_a0._M_head_impl;
  local_a8._M_head_impl = (EventKlass *)((ulong)local_a8._M_head_impl._4_4_ << 0x20);
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_50,(char (*) [11])"endianness",(char (*) [8])"uint8_t",
             (FieldTypeId *)&local_a8);
  EventKlass::add_field(_Var1._M_head_impl,&local_50);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_50);
  local_20._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
  .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl =
       (tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
        )(tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
          )local_a0._M_head_impl;
  local_a0._M_head_impl = (EventKlass *)0x0;
  _add_klass(this,(unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                   *)&local_20);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_20);
  local_b8._M_head_impl._0_4_ = 2;
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[23],unsigned_int>
            ((parser *)&local_a8,(char (*) [23])"HT_EventKlassInfoEvent",(uint *)&local_b8);
  _Var1._M_head_impl = local_a8._M_head_impl;
  local_b8._M_head_impl._0_4_ = 4;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[14],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_58,(char (*) [14])"info_klass_id",(char (*) [9])"uint32_t",
             (FieldTypeId *)&local_b8);
  EventKlass::add_field(_Var1._M_head_impl,&local_58);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_58);
  _Var1._M_head_impl = local_a8._M_head_impl;
  local_b8._M_head_impl._0_4_ = 9;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[17],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_60,(char (*) [17])"event_klass_name",(char (*) [12])"const char*",
             (FieldTypeId *)&local_b8);
  EventKlass::add_field(_Var1._M_head_impl,&local_60);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_60);
  _Var1._M_head_impl = local_a8._M_head_impl;
  local_b8._M_head_impl = (EventKlass *)((ulong)local_b8._M_head_impl._4_4_ << 0x20);
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[12],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_68,(char (*) [12])"field_count",(char (*) [8])"uint8_t",
             (FieldTypeId *)&local_b8);
  EventKlass::add_field(_Var1._M_head_impl,&local_68);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_68);
  local_28._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
  .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl =
       (tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
        )(tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
          )local_a8._M_head_impl;
  local_a8._M_head_impl = (EventKlass *)0x0;
  _add_klass(this,(unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                   *)&local_28);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_28);
  local_ac = INT16;
  make_unique<HawkTracer::parser::EventKlass,char_const(&)[28],unsigned_int>
            ((parser *)&local_b8,(char (*) [28])"HT_EventKlassFieldInfoEvent",&local_ac);
  _Var1._M_head_impl = local_b8._M_head_impl;
  local_ac = UINT32;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[14],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_70,(char (*) [14])"info_klass_id",(char (*) [9])"uint32_t",&local_ac);
  EventKlass::add_field(_Var1._M_head_impl,&local_70);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_70);
  _Var1._M_head_impl = local_b8._M_head_impl;
  local_ac = STRING;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_78,(char (*) [11])"field_type",(char (*) [12])"const char*",&local_ac)
  ;
  EventKlass::add_field(_Var1._M_head_impl,&local_78);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_78);
  _Var1._M_head_impl = local_b8._M_head_impl;
  local_ac = STRING;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[11],char_const(&)[12],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_80,(char (*) [11])"field_name",(char (*) [12])"const char*",&local_ac)
  ;
  EventKlass::add_field(_Var1._M_head_impl,&local_80);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_80);
  _Var1._M_head_impl = local_b8._M_head_impl;
  local_ac = UINT64;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[5],char_const(&)[9],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_88,(char (*) [5])"size",(char (*) [9])"uint64_t",&local_ac);
  EventKlass::add_field(_Var1._M_head_impl,&local_88);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_88);
  _Var1._M_head_impl = local_b8._M_head_impl;
  local_ac = UINT8;
  make_unique<HawkTracer::parser::EventKlassField,char_const(&)[10],char_const(&)[8],HawkTracer::parser::FieldTypeId>
            ((parser *)&local_90,(char (*) [10])"data_type",(char (*) [8])"uint8_t",&local_ac);
  EventKlass::add_field(_Var1._M_head_impl,&local_90);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(&local_90);
  local_30._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
  .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl =
       (tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
        )(tuple<HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
          )local_b8._M_head_impl;
  local_b8._M_head_impl = (EventKlass *)0x0;
  _add_klass(this,(unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                   *)&local_30);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_30);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_b8);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_a8);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_a0);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>::
  ~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               *)&local_98);
  return;
}

Assistant:

KlassRegister::KlassRegister()
{
    auto base_event = make_unique<EventKlass>("HT_Event", to_underlying(WellKnownKlasses::EventKlass));
    base_event->add_field(make_unique<EventKlassField>("klass_id", "uint32_t", FieldTypeId::UINT32));
    base_event->add_field(make_unique<EventKlassField>("timestamp", "uint64_t", FieldTypeId::UINT64));
    base_event->add_field(make_unique<EventKlassField>("id", "uint64_t", FieldTypeId::UINT64));
    _add_klass(std::move(base_event));

    auto endianness_event = make_unique<EventKlass>("HT_EndiannessInfoEvent", to_underlying(WellKnownKlasses::EndiannessInfoEventKlass));
    endianness_event->add_field(make_unique<EventKlassField>("endianness", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(endianness_event));

    auto klass_info_event = make_unique<EventKlass>("HT_EventKlassInfoEvent", to_underlying(WellKnownKlasses::EventKlassInfoEventKlass));
    klass_info_event->add_field(make_unique<EventKlassField>("info_klass_id", "uint32_t", FieldTypeId::UINT32));
    klass_info_event->add_field(make_unique<EventKlassField>("event_klass_name", "const char*", FieldTypeId::STRING));
    klass_info_event->add_field(make_unique<EventKlassField>("field_count", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(klass_info_event));

    auto klass_field_info_event = make_unique<EventKlass>("HT_EventKlassFieldInfoEvent", to_underlying(WellKnownKlasses::EventKlassFieldInfoEventKlass));
    klass_field_info_event->add_field(make_unique<EventKlassField>("info_klass_id", "uint32_t", FieldTypeId::UINT32));
    klass_field_info_event->add_field(make_unique<EventKlassField>("field_type", "const char*", FieldTypeId::STRING));
    klass_field_info_event->add_field(make_unique<EventKlassField>("field_name", "const char*", FieldTypeId::STRING));
    klass_field_info_event->add_field(make_unique<EventKlassField>("size", "uint64_t", FieldTypeId::UINT64));
    klass_field_info_event->add_field(make_unique<EventKlassField>("data_type", "uint8_t", FieldTypeId::UINT8));
    _add_klass(std::move(klass_field_info_event));
}